

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatabuffer_p.h
# Opt level: O0

void __thiscall
QDataBuffer<QScanConverter::Line>::shrink(QDataBuffer<QScanConverter::Line> *this,qsizetype size)

{
  void *pvVar1;
  longlong *plVar2;
  qsizetype *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  void *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  size_t headerSize;
  
  headerSize = *(size_t *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (qsizetype *)0x0) {
    QtPrivate::sizedFree(in_RDI,in_stack_ffffffffffffffd8,0x64c0f0);
    *in_RDI = in_RSI;
    in_RDI[2] = 0;
    in_RDI[1] = 0;
  }
  else {
    *in_RDI = in_RSI;
    pvVar1 = QtPrivate::fittedRealloc(unaff_retaddr,headerSize,in_RSI,(size_t)in_RDI,(size_t)in_RDI)
    ;
    in_RDI[2] = pvVar1;
    qt_noop();
    plVar2 = std::min<long_long>(in_RDI + 1,(longlong *)&stack0xfffffffffffffff0);
    in_RDI[1] = *plVar2;
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) == headerSize) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void shrink(qsizetype size) {
        Q_ASSERT(capacity >= size);
        if (size) {
            capacity = size;
            buffer = (Type*) QtPrivate::fittedRealloc(static_cast<void*>(buffer), 0, &capacity, sizeof(Type));
            Q_CHECK_PTR(buffer);
            siz = std::min(siz, size);
        } else {
            QtPrivate::sizedFree(buffer, capacity, sizeof(Type));
            capacity = size;
            buffer = nullptr;
            siz = 0;
        }
    }